

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluInitTruthTables(void)

{
  word wVar1;
  word (*pawVar2) [1024];
  long lVar3;
  long lVar4;
  long lVar5;
  
  pawVar2 = TruthAll;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    wVar1 = Truth6[lVar3];
    for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 1) {
      (*pawVar2)[lVar5] = wVar1;
    }
    pawVar2 = pawVar2 + 1;
  }
  lVar5 = 0xbad0f0;
  for (lVar3 = 6; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
      *(ulong *)(lVar5 + lVar4 * 8) = -(ulong)((1 << ((char)lVar3 - 6U & 0x1f) & (uint)lVar4) != 0);
    }
    lVar5 = lVar5 + 0x2000;
  }
  return;
}

Assistant:

void If_CluInitTruthTables()
{
    int i, k;
    assert( CLU_VAR_MAX <= 16 );
    for ( i = 0; i < 6; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = Truth6[i];
    for ( i = 6; i < CLU_VAR_MAX; i++ )
        for ( k = 0; k < CLU_WRD_MAX; k++ )
            TruthAll[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;

//    Extra_PrintHex( stdout, TruthAll[6], 8 ); printf( "\n" );
//    Extra_PrintHex( stdout, TruthAll[7], 8 ); printf( "\n" );
}